

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (nelems + -1) / 0x32 + 1;
  uVar2 = 0;
  if (tostore != -1) {
    uVar2 = tostore << 0x17;
  }
  if (nelems < 0x63cf) {
    uVar2 = uVar2 | base << 6 | iVar1 * 0x4000 | 0x2b;
  }
  else {
    luaK_code(fs,base << 6 | uVar2 | 0x2b);
    uVar2 = iVar1 * 0x40 | 0x2e;
  }
  luaK_code(fs,uVar2);
  fs->freereg = (char)base + '\x01';
  return;
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  int c =  (nelems - 1)/LFIELDS_PER_FLUSH + 1;
  int b = (tostore == LUA_MULTRET) ? 0 : tostore;
  lua_assert(tostore != 0 && tostore <= LFIELDS_PER_FLUSH);
  if (c <= MAXARG_C)
    luaK_codeABC(fs, OP_SETLIST, base, b, c);
  else if (c <= MAXARG_Ax) {
    luaK_codeABC(fs, OP_SETLIST, base, b, 0);
    codeextraarg(fs, c);
  }
  else
    luaX_syntaxerror(fs->ls, "constructor too long");
  fs->freereg = base + 1;  /* free registers with list values */
}